

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi5.cpp
# Opt level: O2

void DSDcc::Viterbi5::traceBack
               (int nbSymbols,uint startState,uchar *out,uchar *m_pathMemory0,uchar *m_pathMemory1,
               uchar *m_pathMemory2,uchar *m_pathMemory3,uchar *m_pathMemory4,uchar *m_pathMemory5,
               uchar *m_pathMemory6,uchar *m_pathMemory7,uchar *m_pathMemory8,uchar *m_pathMemory9,
               uchar *m_pathMemory10,uchar *m_pathMemory11,uchar *m_pathMemory12,
               uchar *m_pathMemory13,uchar *m_pathMemory14,uchar *m_pathMemory15)

{
  uchar *puVar1;
  ulong uVar2;
  uchar uVar3;
  
  uVar2 = (ulong)(uint)nbSymbols;
switchD_00120ede_default:
  if ((int)uVar2 < 1) {
    return;
  }
  uVar2 = uVar2 - 1;
  switch(startState) {
  case 0:
    uVar3 = '\0';
    puVar1 = m_pathMemory0;
    break;
  case 1:
    uVar3 = '\0';
    puVar1 = m_pathMemory1;
    break;
  case 2:
    uVar3 = '\0';
    puVar1 = m_pathMemory2;
    break;
  case 3:
    uVar3 = '\0';
    puVar1 = m_pathMemory3;
    break;
  case 4:
    uVar3 = '\0';
    puVar1 = m_pathMemory4;
    break;
  case 5:
    uVar3 = '\0';
    puVar1 = m_pathMemory5;
    break;
  case 6:
    uVar3 = '\0';
    puVar1 = m_pathMemory6;
    break;
  case 7:
    uVar3 = '\0';
    puVar1 = m_pathMemory7;
    break;
  case 8:
    uVar3 = '\x01';
    puVar1 = m_pathMemory8;
    break;
  case 9:
    uVar3 = '\x01';
    puVar1 = m_pathMemory9;
    break;
  case 10:
    uVar3 = '\x01';
    puVar1 = m_pathMemory10;
    break;
  case 0xb:
    uVar3 = '\x01';
    puVar1 = m_pathMemory11;
    break;
  case 0xc:
    uVar3 = '\x01';
    puVar1 = m_pathMemory12;
    break;
  case 0xd:
    uVar3 = '\x01';
    puVar1 = m_pathMemory13;
    break;
  case 0xe:
    uVar3 = '\x01';
    puVar1 = m_pathMemory14;
    break;
  case 0xf:
    uVar3 = '\x01';
    puVar1 = m_pathMemory15;
    break;
  default:
    goto switchD_00120ede_default;
  }
  startState = (uint)puVar1[uVar2];
  out[uVar2] = uVar3;
  goto switchD_00120ede_default;
}

Assistant:

void Viterbi5::traceBack (
        int nbSymbols,
        unsigned int startState,
        unsigned char *out,
        unsigned char *m_pathMemory0,
        unsigned char *m_pathMemory1,
        unsigned char *m_pathMemory2,
        unsigned char *m_pathMemory3,
        unsigned char *m_pathMemory4,
        unsigned char *m_pathMemory5,
        unsigned char *m_pathMemory6,
        unsigned char *m_pathMemory7,
        unsigned char *m_pathMemory8,
        unsigned char *m_pathMemory9,
        unsigned char *m_pathMemory10,
        unsigned char *m_pathMemory11,
        unsigned char *m_pathMemory12,
        unsigned char *m_pathMemory13,
        unsigned char *m_pathMemory14,
        unsigned char *m_pathMemory15
)
{
    unsigned int state = startState;

    for (int loop = nbSymbols - 1; loop >= 0; loop--)
    {
        switch (state)
        {
        case 0: // if state S0
            state = m_pathMemory0[loop];
            out[loop] = 0;
            break;

        case 1: // if state S1
            state = m_pathMemory1[loop];
            out[loop] = 0;
            break;

        case 2: // if state S2
            state = m_pathMemory2[loop];
            out[loop] = 0;
            break;

        case 3: // if state S3
            state = m_pathMemory3[loop];
            out[loop] = 0;
            break;

        case 4: // if state S4
            state = m_pathMemory4[loop];
            out[loop] = 0;
            break;

        case 5: // if state S5
            state = m_pathMemory5[loop];
            out[loop] = 0;
            break;

        case 6: // if state S6
            state = m_pathMemory6[loop];
            out[loop] = 0;
            break;

        case 7: // if state S7
            state = m_pathMemory7[loop];
            out[loop] = 0;
            break;

        case 8: // if state S8
            state = m_pathMemory8[loop];
            out[loop] = 1;
            break;

        case 9: // if state S9
            state = m_pathMemory9[loop];
            out[loop] = 1;
            break;

        case 10: // if state S10
            state = m_pathMemory10[loop];
            out[loop] = 1;
            break;

        case 11: // if state S11
            state = m_pathMemory11[loop];
            out[loop] = 1;
            break;

        case 12: // if state S12
            state = m_pathMemory12[loop];
            out[loop] = 1;
            break;

        case 13: // if state S13
            state = m_pathMemory13[loop];
            out[loop] = 1;
            break;

        case 14: // if state S14
            state = m_pathMemory14[loop];
            out[loop] = 1;
            break;

        case 15: // if state S15
            state = m_pathMemory15[loop];
            out[loop] = 1;
            break;
        }; // end switch
    }; // end for
}